

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::mark_by_class(Omega_h *this,Mesh *mesh,Int ent_dim,Int class_dim,I32 class_id)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Bytes id_marks;
  Read<int> e2class_id;
  allocator local_89;
  Write<signed_char> local_88;
  Write<signed_char> local_78;
  Write<int> local_68;
  Write<signed_char> local_58 [2];
  
  std::__cxx11::string::string((string *)local_58,"class_id",&local_89);
  Mesh::get_array<int>((Mesh *)&stack0xffffffffffffffc8,(Int)mesh,(string *)(ulong)(uint)ent_dim);
  std::__cxx11::string::~string((string *)local_58);
  Write<int>::Write(&local_68,(Write<int> *)&stack0xffffffffffffffc8);
  each_eq_to<int>((Omega_h *)local_58,(Read<int> *)&local_68,class_id);
  Write<int>::~Write(&local_68);
  Write<signed_char>::Write(&local_78,local_58);
  mark_by_class_dim((Omega_h *)&local_88,mesh,ent_dim,class_dim);
  land_each(this,(Bytes *)&local_78,(Bytes *)&local_88);
  Write<signed_char>::~Write(&local_88);
  Write<signed_char>::~Write(&local_78);
  Write<signed_char>::~Write(local_58);
  Write<int>::~Write((Write<int> *)&stack0xffffffffffffffc8);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_by_class(Mesh* mesh, Int ent_dim, Int class_dim, I32 class_id) {
  auto e2class_id = mesh->get_array<ClassId>(ent_dim, "class_id");
  auto id_marks = each_eq_to(e2class_id, class_id);
  return land_each(id_marks, mark_by_class_dim(mesh, ent_dim, class_dim));
}